

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vtk.cpp
# Opt level: O0

void Omega_h::vtk::write_vtu(ostream *stream,Mesh *mesh,Int cell_dim,TagSet *tags,bool compress)

{
  int iVar1;
  Mesh *pMVar2;
  Mesh *pMVar3;
  bool bVar4;
  bool bVar5;
  Int IVar6;
  char *file;
  string *psVar7;
  const_reference pvVar8;
  size_type sVar9;
  Tag<long> *pTVar10;
  TagBase *pTVar11;
  TagBase *tag_1;
  Int i_1;
  allocator local_211;
  string local_210 [37];
  byte local_1eb;
  byte local_1ea;
  allocator local_1e9;
  string local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [32];
  TagBase *local_1a0;
  TagBase *tag;
  Int i;
  byte local_16b;
  byte local_16a;
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [32];
  Read<double> local_120;
  Read<double> local_110;
  allocator local_f9;
  string local_f8 [32];
  undefined1 local_d8 [8];
  Reals coords;
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [38];
  ScopedTimer local_2a;
  byte local_29;
  ScopedTimer omega_h_scoped_function_timer;
  element_type *peStack_28;
  bool compress_local;
  TagSet *tags_local;
  Mesh *pMStack_18;
  Int cell_dim_local;
  Mesh *mesh_local;
  ostream *stream_local;
  
  local_29 = compress;
  peStack_28 = (element_type *)tags;
  tags_local._4_4_ = cell_dim;
  pMStack_18 = mesh;
  mesh_local = (Mesh *)stream;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
             ,(allocator *)&stack0xffffffffffffff6f);
  std::operator+(local_70,(char *)local_90);
  std::__cxx11::to_string((__cxx11 *)&coords.write_.shared_alloc_.direct_ptr,0x25c);
  std::operator+(local_50,local_70);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_2a,"write_vtu",file);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)&coords.write_.shared_alloc_.direct_ptr);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
  default_dim(pMStack_18,(Int *)((long)&tags_local + 4));
  verify_vtk_tagset(pMStack_18,tags_local._4_4_,(TagSet *)peStack_28);
  write_vtkfile_vtu_start_tag((ostream *)mesh_local,(bool)(local_29 & 1));
  std::operator<<((ostream *)mesh_local,"<UnstructuredGrid>\n");
  write_piece_start_tag((ostream *)mesh_local,pMStack_18,tags_local._4_4_);
  std::operator<<((ostream *)mesh_local,"<Cells>\n");
  write_connectivity((ostream *)mesh_local,pMStack_18,tags_local._4_4_,(bool)(local_29 & 1));
  std::operator<<((ostream *)mesh_local,"</Cells>\n");
  std::operator<<((ostream *)mesh_local,"<Points>\n");
  Omega_h::Mesh::coords((Mesh *)local_d8);
  pMVar2 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"coordinates",&local_f9);
  Read<double>::Read(&local_120,(Read<double> *)local_d8);
  IVar6 = Omega_h::Mesh::dim(pMStack_18);
  resize_vectors((Omega_h *)&local_110,&local_120,IVar6,3);
  write_array<double,double>((ostream *)pMVar2,(string *)local_f8,3,&local_110,(bool)(local_29 & 1))
  ;
  Read<double>::~Read(&local_110);
  Read<double>::~Read(&local_120);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::operator<<((ostream *)mesh_local,"</Points>\n");
  std::operator<<((ostream *)mesh_local,"<PointData>\n");
  pMVar2 = pMStack_18;
  std::allocator<char>::allocator();
  local_16a = 0;
  local_16b = 0;
  std::__cxx11::string::string(local_140,"global",&local_141);
  bVar4 = Omega_h::Mesh::has_tag(pMVar2,0,(string *)local_140);
  bVar5 = false;
  if (bVar4) {
    pvVar8 = std::
             array<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL>
             ::operator[]((array<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL>
                           *)peStack_28,0);
    std::allocator<char>::allocator();
    local_16a = 1;
    std::__cxx11::string::string(local_168,"global",&local_169);
    local_16b = 1;
    sVar9 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(pvVar8,(key_type *)local_168);
    bVar5 = sVar9 != 0;
  }
  if ((local_16b & 1) != 0) {
    std::__cxx11::string::~string(local_168);
  }
  if ((local_16a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
  }
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  pMVar3 = mesh_local;
  pMVar2 = pMStack_18;
  if (bVar5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&i,"global",(allocator *)((long)&tag + 7));
    pTVar10 = Omega_h::Mesh::get_tag<long>(pMVar2,0,(string *)&i);
    IVar6 = Omega_h::Mesh::dim(pMStack_18);
    write_tag((ostream *)pMVar3,&pTVar10->super_TagBase,IVar6,(bool)(local_29 & 1));
    std::__cxx11::string::~string((string *)&i);
    std::allocator<char>::~allocator((allocator<char> *)((long)&tag + 7));
  }
  write_locals_and_owners
            ((ostream *)mesh_local,pMStack_18,0,(TagSet *)peStack_28,(bool)(local_29 & 1));
  for (tag._0_4_ = 0; iVar1 = (int)tag, IVar6 = Omega_h::Mesh::ntags(pMStack_18,0), iVar1 < IVar6;
      tag._0_4_ = (int)tag + 1) {
    local_1a0 = Omega_h::Mesh::get_tag(pMStack_18,0,(int)tag);
    psVar7 = TagBase::name_abi_cxx11_(local_1a0);
    bVar5 = std::operator!=(psVar7,"coordinates");
    if (bVar5) {
      psVar7 = TagBase::name_abi_cxx11_(local_1a0);
      bVar5 = std::operator!=(psVar7,"global");
      if (bVar5) {
        pvVar8 = std::
                 array<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL>
                 ::operator[]((array<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL>
                               *)peStack_28,0);
        psVar7 = TagBase::name_abi_cxx11_(local_1a0);
        sVar9 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(pvVar8,psVar7);
        pMVar2 = mesh_local;
        pTVar11 = local_1a0;
        if (sVar9 != 0) {
          IVar6 = Omega_h::Mesh::dim(pMStack_18);
          write_tag((ostream *)pMVar2,pTVar11,IVar6,(bool)(local_29 & 1));
        }
      }
    }
  }
  std::operator<<((ostream *)mesh_local,"</PointData>\n");
  std::operator<<((ostream *)mesh_local,"<CellData>\n");
  pMVar2 = pMStack_18;
  IVar6 = tags_local._4_4_;
  std::allocator<char>::allocator();
  local_1ea = 0;
  local_1eb = 0;
  std::__cxx11::string::string(local_1c0,"global",&local_1c1);
  bVar4 = Omega_h::Mesh::has_tag(pMVar2,IVar6,(string *)local_1c0);
  bVar5 = false;
  if (bVar4) {
    pvVar8 = std::
             array<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL>
             ::operator[]((array<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL>
                           *)peStack_28,(long)tags_local._4_4_);
    std::allocator<char>::allocator();
    local_1ea = 1;
    std::__cxx11::string::string(local_1e8,"global",&local_1e9);
    local_1eb = 1;
    sVar9 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(pvVar8,(key_type *)local_1e8);
    bVar5 = sVar9 != 0;
  }
  if ((local_1eb & 1) != 0) {
    std::__cxx11::string::~string(local_1e8);
  }
  if ((local_1ea & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  }
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  pMVar3 = mesh_local;
  pMVar2 = pMStack_18;
  IVar6 = tags_local._4_4_;
  if (bVar5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_210,"global",&local_211);
    pTVar10 = Omega_h::Mesh::get_tag<long>(pMVar2,IVar6,(string *)local_210);
    IVar6 = Omega_h::Mesh::dim(pMStack_18);
    write_tag((ostream *)pMVar3,&pTVar10->super_TagBase,IVar6,(bool)(local_29 & 1));
    std::__cxx11::string::~string(local_210);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
  }
  write_locals_and_owners
            ((ostream *)mesh_local,pMStack_18,tags_local._4_4_,(TagSet *)peStack_28,
             (bool)(local_29 & 1));
  pvVar8 = std::
           array<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL>
           ::operator[]((array<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL>
                         *)peStack_28,(long)tags_local._4_4_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i_1,"vtkGhostType",(allocator *)((long)&tag_1 + 7));
  sVar9 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(pvVar8,(key_type *)&i_1);
  std::__cxx11::string::~string((string *)&i_1);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tag_1 + 7));
  if (sVar9 != 0) {
    write_vtk_ghost_types((ostream *)mesh_local,pMStack_18,tags_local._4_4_,(bool)(local_29 & 1));
  }
  for (tag_1._0_4_ = 0; iVar1 = (int)tag_1,
      IVar6 = Omega_h::Mesh::ntags(pMStack_18,tags_local._4_4_), iVar1 < IVar6;
      tag_1._0_4_ = (int)tag_1 + 1) {
    pTVar11 = Omega_h::Mesh::get_tag(pMStack_18,tags_local._4_4_,(int)tag_1);
    psVar7 = TagBase::name_abi_cxx11_(pTVar11);
    bVar5 = std::operator!=(psVar7,"global");
    if (bVar5) {
      pvVar8 = std::
               array<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL>
               ::operator[]((array<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL>
                             *)peStack_28,(long)tags_local._4_4_);
      psVar7 = TagBase::name_abi_cxx11_(pTVar11);
      sVar9 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(pvVar8,psVar7);
      pMVar2 = mesh_local;
      if (sVar9 != 0) {
        IVar6 = Omega_h::Mesh::dim(pMStack_18);
        write_tag((ostream *)pMVar2,pTVar11,IVar6,(bool)(local_29 & 1));
      }
    }
  }
  std::operator<<((ostream *)mesh_local,"</CellData>\n");
  std::operator<<((ostream *)mesh_local,"</Piece>\n");
  std::operator<<((ostream *)mesh_local,"</UnstructuredGrid>\n");
  std::operator<<((ostream *)mesh_local,"</VTKFile>\n");
  Read<double>::~Read((Read<double> *)local_d8);
  ScopedTimer::~ScopedTimer(&local_2a);
  return;
}

Assistant:

void write_vtu(std::ostream& stream, Mesh* mesh, Int cell_dim,
    TagSet const& tags, bool compress) {
  OMEGA_H_TIME_FUNCTION;
  default_dim(mesh, &cell_dim);
  verify_vtk_tagset(mesh, cell_dim, tags);
  write_vtkfile_vtu_start_tag(stream, compress);
  stream << "<UnstructuredGrid>\n";
  write_piece_start_tag(stream, mesh, cell_dim);
  stream << "<Cells>\n";
  write_connectivity(stream, mesh, cell_dim, compress);
  stream << "</Cells>\n";
  stream << "<Points>\n";
  auto coords = mesh->coords();
  write_array(stream, "coordinates", 3, resize_vectors(coords, mesh->dim(), 3),
      compress);
  stream << "</Points>\n";
  stream << "<PointData>\n";
  /* globals go first so read_vtu() knows where to find them */
  if (mesh->has_tag(VERT, "global") && tags[VERT].count("global")) {
    write_tag(stream, mesh->get_tag<GO>(VERT, "global"), mesh->dim(), compress);
  }
  write_locals_and_owners(stream, mesh, VERT, tags, compress);
  for (Int i = 0; i < mesh->ntags(VERT); ++i) {
    auto tag = mesh->get_tag(VERT, i);
    if (tag->name() != "coordinates" && tag->name() != "global" &&
        tags[VERT].count(tag->name())) {
      write_tag(stream, tag, mesh->dim(), compress);
    }
  }
  stream << "</PointData>\n";
  stream << "<CellData>\n";
  /* globals go first so read_vtu() knows where to find them */
  if (mesh->has_tag(cell_dim, "global") &&
      tags[size_t(cell_dim)].count("global")) {
    write_tag(
        stream, mesh->get_tag<GO>(cell_dim, "global"), mesh->dim(), compress);
  }
  write_locals_and_owners(stream, mesh, cell_dim, tags, compress);
  if (tags[size_t(cell_dim)].count("vtkGhostType")) {
    write_vtk_ghost_types(stream, mesh, cell_dim, compress);
  }
  for (Int i = 0; i < mesh->ntags(cell_dim); ++i) {
    auto tag = mesh->get_tag(cell_dim, i);
    if (tag->name() != "global" && tags[size_t(cell_dim)].count(tag->name())) {
      write_tag(stream, tag, mesh->dim(), compress);
    }
  }
  stream << "</CellData>\n";
  stream << "</Piece>\n";
  stream << "</UnstructuredGrid>\n";
  stream << "</VTKFile>\n";
}